

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

int * Abc_NamStrHashFind(Abc_Nam_t *p,char *pStr,char *pLim)

{
  int iVar1;
  int *local_48;
  int *local_40;
  int *local_30;
  int *pPlace;
  char *pThis;
  char *pLim_local;
  char *pStr_local;
  Abc_Nam_t *p_local;
  
  local_30 = p->pBins;
  iVar1 = Abc_NamStrHash(pStr,pLim,p->nBins);
  local_30 = local_30 + iVar1;
  if (*pStr != '\0') {
    if (*local_30 == 0) {
      local_40 = (int *)0x0;
    }
    else {
      local_40 = (int *)Abc_NamIntToStr(p,*local_30);
    }
    pPlace = local_40;
    while ((pPlace != (int *)0x0 && (iVar1 = Abc_NamStrcmp(pStr,pLim,(char *)pPlace), iVar1 != 0)))
    {
      local_30 = Abc_NamIntToNextP(p,*local_30);
      if (*local_30 == 0) {
        local_48 = (int *)0x0;
      }
      else {
        local_48 = (int *)Abc_NamIntToStr(p,*local_30);
      }
      pPlace = local_48;
    }
    return local_30;
  }
  __assert_fail("*pStr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x137,"int *Abc_NamStrHashFind(Abc_Nam_t *, const char *, const char *)");
}

Assistant:

static inline int * Abc_NamStrHashFind( Abc_Nam_t * p, const char * pStr, const char * pLim )
{
    char * pThis;
    int * pPlace = (int *)(p->pBins + Abc_NamStrHash( pStr, pLim, p->nBins ));
    assert( *pStr );
    for ( pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL; 
          pThis;    pPlace = Abc_NamIntToNextP(p, *pPlace), 
          pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL )
              if ( !Abc_NamStrcmp( (char *)pStr, (char *)pLim, pThis ) )
                  break;
    return pPlace;
}